

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NIVS.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::NIVSMethod::NIVSMethod(NIVSMethod *this,SimInfo *info,ForceManager *forceMan)

{
  bool bVar1;
  bool bVar2;
  RNEMDFluxType RVar3;
  RNEMDParameters *pRVar4;
  double dVar5;
  allocator_type local_51;
  vector<double,_std::allocator<double>_> momentumFluxVector;
  
  RNEMD::RNEMD(&this->super_RNEMD,info,forceMan);
  (this->super_RNEMD)._vptr_RNEMD = (_func_int **)&PTR__RNEMD_002c6668;
  std::__cxx11::string::assign((char *)&(this->super_RNEMD).rnemdMethodLabel_);
  pRVar4 = info->simParams_->rnemdPars_;
  bVar1 = (pRVar4->KineticFlux).super_ParameterBase.empty_;
  bVar2 = (pRVar4->MomentumFlux).super_ParameterBase.empty_;
  RVar3 = (this->super_RNEMD).rnemdFluxType_;
  if (RVar3 < rnemdKePvector) {
    if ((7U >> (RVar3 & (rnemdKePvector|rnemdKePy)) & 1) == 0) {
      if ((0x38U >> (RVar3 & (rnemdKePvector|rnemdKePy)) & 1) == 0) {
        if ((0xc000U >> (RVar3 & (rnemdKePvector|rnemdKePy)) & 1) == 0) goto LAB_001e638a;
        if (bVar1 != false || bVar2 != false) goto LAB_001e63ba;
      }
      else if (bVar2 != false) goto LAB_001e63ba;
      goto LAB_001e63ea;
    }
    if (bVar1 != false) goto LAB_001e63ba;
LAB_001e63f2:
    dVar5 = (pRVar4->KineticFlux).data_;
  }
  else {
LAB_001e638a:
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method,\n\t\tNIVS\n\tcannot be used with the current flux type, %s\n"
             ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
LAB_001e63ba:
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method, NIVS, and flux type, %s,\n\tdid not have the correct flux value specified. Options\n\tinclude: kineticFlux and momentumFlux.\n"
             ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
LAB_001e63ea:
    dVar5 = 0.0;
    if (bVar1 == false) goto LAB_001e63f2;
  }
  RNEMD::setKineticFlux(&this->super_RNEMD,dVar5);
  if (bVar2 != false) {
    return;
  }
  dVar5 = (pRVar4->MomentumFlux).data_;
  std::vector<double,_std::allocator<double>_>::vector(&momentumFluxVector,3,&local_51);
  RVar3 = (this->super_RNEMD).rnemdFluxType_;
  if (RVar3 != rnemdPx) {
    if (RVar3 == rnemdPy) {
      momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    else {
      if (RVar3 != rnemdPz) goto LAB_001e6463;
      momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 2;
    }
  }
  *momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = dVar5;
LAB_001e6463:
  RNEMD::setMomentumFluxVector(&this->super_RNEMD,&momentumFluxVector);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&momentumFluxVector.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

NIVSMethod::NIVSMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan} {
    rnemdMethodLabel_ = "NIVS";

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    bool hasKineticFlux  = rnemdParams->haveKineticFlux();
    bool hasMomentumFlux = rnemdParams->haveMomentumFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdKE:
    case rnemdRotKE:
    case rnemdFullKE:
      hasCorrectFlux = hasKineticFlux;
      break;
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
      hasCorrectFlux = hasMomentumFlux;
      break;
    case rnemdKePx:
    case rnemdKePy:
      hasCorrectFlux = hasMomentumFlux && hasKineticFlux;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method,\n"
               "\t\tNIVS\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, NIVS, and flux type, %s,\n"
               "\tdid not have the correct flux value specified. Options\n"
               "\tinclude: kineticFlux and momentumFlux.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    if (hasMomentumFlux) {
      RealType momentumFlux = rnemdParams->getMomentumFlux();
      std::vector<RealType> momentumFluxVector(3);

      switch (rnemdFluxType_) {
      case rnemdPx:
        momentumFluxVector[0] = momentumFlux;
        break;
      case rnemdPy:
        momentumFluxVector[1] = momentumFlux;
        break;
      case rnemdPz:
        momentumFluxVector[2] = momentumFlux;
        break;
      default:
        break;
      }

      setMomentumFluxVector(momentumFluxVector);
    }
  }